

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O1

void Fxu_ListMatrixDelVariable(Fxu_Matrix *p,Fxu_Var *pLink)

{
  int *piVar1;
  Fxu_Var *pFVar2;
  
  if ((p->lVars).pHead == pLink) {
    (p->lVars).pHead = pLink->pNext;
  }
  if ((p->lVars).pTail == pLink) {
    (p->lVars).pTail = pLink->pPrev;
  }
  pFVar2 = pLink->pPrev;
  if (pFVar2 != (Fxu_Var *)0x0) {
    pFVar2->pNext = pLink->pNext;
  }
  if (pLink->pNext != (Fxu_Var *)0x0) {
    pLink->pNext->pPrev = pFVar2;
  }
  piVar1 = &(p->lVars).nItems;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void Fxu_ListMatrixDelVariable( Fxu_Matrix * p, Fxu_Var * pLink )
{
    Fxu_ListVar * pList = &p->lVars;
    if ( pList->pHead == pLink )
         pList->pHead = pLink->pNext;
    if ( pList->pTail == pLink )
         pList->pTail = pLink->pPrev;
    if ( pLink->pPrev )
         pLink->pPrev->pNext = pLink->pNext;
    if ( pLink->pNext )
         pLink->pNext->pPrev = pLink->pPrev;
    pList->nItems--;
}